

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PixTone.cpp
# Opt level: O3

BOOL MakePixelWaveData(PIXTONEPARAMETER *ptp,uchar *pData)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  char envelopeTable [256];
  char local_128 [264];
  
  MakeWaveTables();
  uVar5 = 0;
  memset(local_128,0,0x100);
  uVar2 = ptp->pointAx;
  if (0 < (long)(int)uVar2) {
    dVar12 = (double)ptp->initial;
    dVar13 = (double)ptp->pointAy - dVar12;
    lVar4 = 0;
    do {
      local_128[lVar4] = (char)(int)dVar12;
      dVar12 = dVar12 + dVar13 / (double)(int)uVar2;
      lVar4 = lVar4 + 1;
    } while ((int)uVar2 != lVar4);
    uVar5 = (ulong)uVar2;
  }
  uVar10 = ptp->pointBx;
  uVar11 = uVar5;
  if ((int)uVar5 < (int)uVar10) {
    dVar12 = (double)ptp->pointAy;
    dVar13 = (double)ptp->pointBy - dVar12;
    do {
      local_128[uVar5] = (char)(int)dVar12;
      dVar12 = dVar12 + dVar13 / (double)(int)(uVar10 - uVar2);
      uVar5 = uVar5 + 1;
      uVar11 = (ulong)uVar10;
    } while (uVar10 != uVar5);
  }
  iVar3 = ptp->pointCx;
  if ((int)uVar11 < iVar3) {
    dVar12 = (double)ptp->pointBy;
    dVar13 = (double)ptp->pointCy - dVar12;
    do {
      local_128[uVar11] = (char)(int)dVar12;
      dVar12 = dVar12 + dVar13 / (double)(int)(iVar3 - uVar10);
      uVar11 = uVar11 + 1;
    } while ((int)uVar11 < iVar3);
  }
  if ((uint)uVar11 < 0x100) {
    dVar12 = (double)ptp->pointCy;
    dVar13 = dVar12 / (double)(0x100 - iVar3);
    uVar5 = uVar11 & 0xffffffff;
    do {
      uVar11 = uVar5 + 1;
      local_128[uVar5] = (char)(int)dVar12;
      dVar12 = dVar12 - dVar13;
      uVar5 = uVar11;
    } while ((int)uVar11 != 0x100);
  }
  dVar12 = (ptp->oMain).num;
  dVar13 = 0.0;
  dVar14 = 0.0;
  if ((dVar12 != 0.0) || (NAN(dVar12))) {
    dVar14 = 256.0 / ((double)ptp->size / dVar12);
  }
  dVar12 = (ptp->oPitch).num;
  if ((dVar12 != 0.0) || (NAN(dVar12))) {
    dVar13 = 256.0 / ((double)ptp->size / dVar12);
  }
  uVar2 = ptp->size;
  uVar5 = (ulong)uVar2;
  if (0 < (int)uVar2) {
    dVar15 = (double)(ptp->oPitch).offset;
    dVar16 = (double)(ptp->oMain).offset;
    dVar17 = (double)(ptp->oVolume).offset;
    dVar12 = (ptp->oVolume).num;
    iVar3 = 0;
    lVar4 = 0;
    do {
      iVar8 = (int)gWaveModelTable[(ptp->oMain).model][(int)dVar16 % 0x100] * (ptp->oMain).top;
      iVar6 = iVar8 + 0x3f;
      if (-1 < iVar8) {
        iVar6 = iVar8;
      }
      iVar9 = (int)gWaveModelTable[(ptp->oVolume).model][(int)dVar17 % 0x100] * (ptp->oVolume).top;
      iVar8 = iVar9 + 0x3f;
      if (-1 < iVar9) {
        iVar8 = iVar9;
      }
      iVar8 = ((iVar8 >> 6) + 0x40) * (iVar6 >> 6);
      iVar6 = iVar8 + 0x3f;
      if (-1 < iVar8) {
        iVar6 = iVar8;
      }
      uVar7 = (int)local_128[(int)((double)iVar3 / (double)(int)uVar5)] * (iVar6 >> 6);
      uVar10 = uVar7 + 0x3f;
      if (-1 < (int)uVar7) {
        uVar10 = uVar7;
      }
      pData[lVar4] = (char)(uVar10 >> 6) + 0x80;
      cVar1 = gWaveModelTable[(ptp->oPitch).model][(int)dVar15 % 0x100];
      if (cVar1 < '\0') {
        dVar18 = dVar14 - (double)(ptp->oPitch).top * (double)-(int)cVar1 * dVar14 * 0.5 * 0.015625
                          * 0.015625;
      }
      else {
        dVar18 = (double)(ptp->oPitch).top * (double)(int)cVar1 * (dVar14 + dVar14) * 0.015625 *
                 0.015625 + dVar14;
      }
      dVar16 = dVar16 + dVar18;
      dVar15 = dVar15 + dVar13;
      dVar17 = dVar17 + (double)(~-(ulong)(dVar12 == 0.0) &
                                (ulong)(256.0 / ((double)(int)uVar2 / dVar12)));
      lVar4 = lVar4 + 1;
      uVar5 = (ulong)ptp->size;
      iVar3 = iVar3 + 0x100;
    } while (lVar4 < (long)uVar5);
  }
  return true;
}

Assistant:

BOOL MakePixelWaveData(const PIXTONEPARAMETER *ptp, unsigned char *pData)
{
	int i;
	int a, b, c, d;

	double dPitch;
	double dMain;
	double dVolume;

	double dEnvelope;
	signed char envelopeTable[0x100];

	double d1, d2, d3;

	// The Linux port added a cute optimisation here, where MakeWaveTables is only called once during the game's execution
	//if (wave_tables_made != TRUE)
	//{
		MakeWaveTables();
	//	wave_tables_made = TRUE;
	//}

	memset(envelopeTable, 0, sizeof(envelopeTable));

	i = 0;

	dEnvelope = ptp->initial;
	while (i < ptp->pointAx)
	{
		envelopeTable[i] = (signed char)dEnvelope;
		dEnvelope = (((double)ptp->pointAy - ptp->initial) / ptp->pointAx) + dEnvelope;
		++i;
	}

	dEnvelope = ptp->pointAy;
	while (i < ptp->pointBx)
	{
		envelopeTable[i] = (signed char)dEnvelope;
		dEnvelope = (((double)ptp->pointBy - ptp->pointAy) / (double)(ptp->pointBx - ptp->pointAx)) + dEnvelope;
		++i;
	}

	dEnvelope = ptp->pointBy;
	while (i < ptp->pointCx)
	{
		envelopeTable[i] = (signed char)dEnvelope;
		dEnvelope = ((double)ptp->pointCy - ptp->pointBy) / (double)(ptp->pointCx - ptp->pointBx) + dEnvelope;
		++i;
	}

	dEnvelope = ptp->pointCy;
	while (i < 0x100)
	{
		envelopeTable[i] = (signed char)dEnvelope;
		dEnvelope = dEnvelope - (ptp->pointCy / (double)(0x100 - ptp->pointCx));
		++i;
	}

	dPitch = ptp->oPitch.offset;
	dMain = ptp->oMain.offset;
	dVolume = ptp->oVolume.offset;

	if (ptp->oMain.num == 0.0)
		d1 = 0.0;
	else
		d1 = 256.0 / (ptp->size / ptp->oMain.num);

	if (ptp->oPitch.num == 0.0)
		d2 = 0.0;
	else
		d2 = 256.0 / (ptp->size / ptp->oPitch.num);

	if (ptp->oVolume.num == 0.0)
		d3 = 0.0;
	else
		d3 = 256.0 / (ptp->size / ptp->oVolume.num);

	for (i = 0; i < ptp->size; ++i)
	{
		a = (int)dMain % 0x100;
		b = (int)dPitch % 0x100;
		c = (int)dVolume % 0x100;
		d = (int)((double)(i * 0x100) / ptp->size);
		pData[i] = gWaveModelTable[ptp->oMain.model][a]
		         * ptp->oMain.top
		         / 64
		         * (((gWaveModelTable[ptp->oVolume.model][c] * ptp->oVolume.top) / 64) + 64)
		         / 64
		         * envelopeTable[d]
		         / 64
		         + 128;

		if (gWaveModelTable[ptp->oPitch.model][b] < 0)
			dMain = d1 - d1 * 0.5 * -gWaveModelTable[ptp->oPitch.model][b] * ptp->oPitch.top / 64.0 / 64.0 + dMain;
		else
			dMain = d1 + d1 * 2.0 * gWaveModelTable[ptp->oPitch.model][b] * ptp->oPitch.top / 64.0 / 64.0 + dMain;

		dPitch = dPitch + d2;
		dVolume = dVolume + d3;
	}

	return TRUE;
}